

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev-primality-test.cpp
# Opt level: O0

matrix * __thiscall matrix::operator*(matrix *this,matrix *other)

{
  matrix *this_00;
  uint64_t in_RSI;
  matrix *in_RDI;
  uint64_t r;
  matrix *ret;
  polynomial *in_stack_fffffffffffffe08;
  polynomial *in_stack_fffffffffffffe10;
  polynomial *this_01;
  matrix *n;
  polynomial *in_stack_fffffffffffffe50;
  polynomial *in_stack_fffffffffffffe58;
  polynomial *in_stack_fffffffffffffe60;
  polynomial *in_stack_fffffffffffffe68;
  polynomial local_118 [7];
  undefined1 local_21;
  size_type local_20;
  
  this_00 = (matrix *)(in_RSI + 8);
  n = in_RDI;
  local_20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x10));
  local_21 = 0;
  matrix(this_00,in_RSI,(uint64_t)n);
  polynomial::operator*(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  polynomial::operator*(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  polynomial::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  polynomial::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  polynomial::~polynomial((polynomial *)0x11d853);
  polynomial::~polynomial((polynomial *)0x11d860);
  polynomial::~polynomial((polynomial *)0x11d86d);
  polynomial::operator*(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  polynomial::operator*(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  polynomial::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  polynomial::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  polynomial::~polynomial((polynomial *)0x11d8f9);
  polynomial::~polynomial((polynomial *)0x11d906);
  polynomial::~polynomial((polynomial *)0x11d913);
  polynomial::operator*(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  polynomial::operator*(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  polynomial::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  this_01 = local_118;
  polynomial::operator=(this_01,in_stack_fffffffffffffe08);
  polynomial::~polynomial((polynomial *)0x11d99f);
  polynomial::~polynomial((polynomial *)0x11d9ac);
  polynomial::~polynomial((polynomial *)0x11d9b9);
  polynomial::operator*(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  polynomial::operator*(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  polynomial::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  polynomial::operator=(this_01,in_stack_fffffffffffffe08);
  polynomial::~polynomial((polynomial *)0x11da37);
  polynomial::~polynomial((polynomial *)0x11da41);
  polynomial::~polynomial((polynomial *)0x11da4b);
  return in_RDI;
}

Assistant:

matrix operator* (const matrix& other){
        uint64_t r = p00.p.size();
        matrix ret(r, n);
        ret.p00 = this->p00*other.p00 + this->p01*other.p10;
        ret.p01 = this->p00*other.p01 + this->p01*other.p11;
        ret.p10 = this->p10*other.p00 + this->p11*other.p10;
        ret.p11 = this->p10*other.p01 + this->p11*other.p11;
        return ret;
    }